

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void kratos::set_var_params
               (Var *var,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               *parameters)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
  *this;
  __buckets_ptr pp_Var3;
  __buckets_ptr pp_Var4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  Var *pVVar9;
  uint32_t index;
  ulong uVar10;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Var *local_38;
  
  pVVar9 = var->width_param_;
  local_38 = var;
  if (pVVar9 != (Var *)0x0) {
    p_Var6 = (parameters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_38 = var,
          (_Rb_tree_header *)p_Var6 != &(parameters->_M_t)._M_impl.super__Rb_tree_header) {
      iVar5 = (*(pVVar9->super_IRNode)._vptr_IRNode[0x1b])(pVVar9);
      if ((char)iVar5 != '\0') {
        Var::as<kratos::Param>((Var *)&stack0xffffffffffffffb8);
        pp_Var3 = local_48[1].sinks_._M_h._M_buckets;
        pp_Var4 = *(__buckets_ptr *)(p_Var6 + 2);
        if ((pointer)local_40._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
        }
        if (pp_Var3 == pp_Var4) {
          local_48 = pVVar9;
          std::
          _Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(*(long *)(p_Var6 + 2) + 0x2c8),&stack0xffffffffffffffb8);
          local_48 = *(element_type **)(p_Var6 + 2);
          local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[2]._M_parent;
          if ((pointer)local_40._M_pi != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pp_Var1 = (_Base_ptr *)&(((pointer)local_40._M_pi)->first)._M_string_length;
              *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
              UNLOCK();
            }
            else {
              pp_Var1 = (_Base_ptr *)&(((pointer)local_40._M_pi)->first)._M_string_length;
              *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
            }
          }
          Var::set_width_param(local_38,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffb8);
          var = local_38;
          if ((pointer)local_40._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
            var = local_38;
          }
          goto LAB_00168ab7;
        }
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      var = local_38;
    }
    (*(var->super_IRNode)._vptr_IRNode[0x23])(var,0);
  }
LAB_00168ab7:
  if ((var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this = &var->size_param_;
    p_Var2 = &(parameters->_M_t)._M_impl.super__Rb_tree_header;
    uVar10 = 0;
    do {
      index = (uint32_t)uVar10;
      local_48 = (element_type *)CONCAT44(local_48._4_4_,index);
      cVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this->_M_h,(key_type *)&stack0xffffffffffffffb8);
      if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pVVar9 = (Var *)0x0;
      }
      else {
        cVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this->_M_h,(key_type *)&stack0xffffffffffffffb8);
        if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        pVVar9 = *(Var **)((long)cVar7.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                                 ._M_cur + 0x10);
        p_Var8 = (parameters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)p_Var8 != p_Var2 && pVVar9 != (Var *)0x0) {
          do {
            iVar5 = (*(pVVar9->super_IRNode)._vptr_IRNode[0x1b])(pVVar9);
            if ((char)iVar5 != '\0') {
              Var::as<kratos::Param>((Var *)&stack0xffffffffffffffb8);
              pp_Var3 = local_48[1].sinks_._M_h._M_buckets;
              pp_Var4 = *(__buckets_ptr *)(p_Var8 + 2);
              if ((pointer)local_40._M_pi != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
              }
              var = local_38;
              if (pp_Var3 == pp_Var4) {
                Param::remove_param_size_var(*(Param **)(p_Var8 + 2),local_38,index,pVVar9);
                pVVar9 = *(Var **)(p_Var8 + 2);
                goto LAB_00168bc1;
              }
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != p_Var2);
        }
        pVVar9 = (Var *)0x0;
        var = local_38;
      }
LAB_00168bc1:
      Var::set_size_param(var,index,pVVar9);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(var->size_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(var->size_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void set_var_params(Var *var, const std::map<std::string, std::shared_ptr<Param>> &parameters) {
    auto *param = var->width_param();
    if (param) {
        // brute force
        bool found = false;
        for (auto const &iter : parameters) {
            auto const &parent_param = iter.second;
            // for now, we only support exact match
            if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                // found it
                parent_param->remove_param_width_var(param);
                var->set_width_param(parent_param);
                found = true;
                break;
            }
        }
        if (!found) {
            var->set_width_param(nullptr);
        }
    }

    // size param as well
    for (uint64_t i = 0; i < var->size().size(); i++) {
        param = var->get_size_param(i);
        if (param) {
            // brute force
            bool found = false;
            for (auto const &iter : parameters) {
                auto const &parent_param = iter.second;
                // for now, we only support exact match
                if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                    // found it
                    parent_param->remove_param_size_var(var, i, param);
                    var->set_size_param(i, parent_param.get());
                    found = true;
                    break;
                }
            }
            if (!found) {
                var->set_size_param(i, nullptr);
            }
        } else {
            var->set_size_param(i, nullptr);
        }
    }
}